

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

amqp_table_entry_t * amqp_table_get_entry_by_key(amqp_table_t *table,amqp_bytes_t key)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  amqp_bytes_t r;
  
  lVar4 = -1;
  lVar1 = -0x28;
  do {
    lVar3 = lVar1;
    lVar4 = lVar4 + 1;
    if (table->num_entries <= lVar4) {
      return (amqp_table_entry_t *)0x0;
    }
    r.bytes = *(void **)((long)&table->entries[1].key.bytes + lVar3);
    r.len = *(size_t *)((long)&table->entries[1].key.len + lVar3);
    iVar2 = amqp_bytes_equal(r,key);
    lVar1 = lVar3 + 0x28;
  } while (iVar2 == 0);
  return (amqp_table_entry_t *)((long)&table->entries[1].key.len + lVar3);
}

Assistant:

amqp_table_entry_t *amqp_table_get_entry_by_key(const amqp_table_t *table,
                                                const amqp_bytes_t key) {
  int i;
  assert(table != NULL);
  for (i = 0; i < table->num_entries; ++i) {
    if (amqp_bytes_equal(table->entries[i].key, key)) {
      return &table->entries[i];
    }
  }
  return NULL;
}